

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.h
# Opt level: O2

void TestEq<float,float>(float expval,float val,char *exp,char *file,int line,char *func)

{
  string local_68;
  string local_48;
  
  if ((expval != val) || (NAN(expval) || NAN(val))) {
    flatbuffers::NumToString<float>(&local_48,expval);
    flatbuffers::NumToString<float>(&local_68,val);
    TestFail(local_48._M_dataplus._M_p,local_68._M_dataplus._M_p,exp,file,line,func);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void TestEq(T expval, U val, const char *exp, const char *file, int line,
            const char *func) {
  if (static_cast<U>(expval) != val) {
    TestFail(flatbuffers::NumToString(scalar_as_underlying(expval)).c_str(),
             flatbuffers::NumToString(scalar_as_underlying(val)).c_str(), exp,
             file, line, func);
  }
}